

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

void Cba_BlastMultiplier(Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vTemp,
                        Vec_Int_t *vRes,int fSigned)

{
  bool local_81;
  int *local_80;
  int local_54;
  int local_50;
  int Carry;
  int b;
  int a;
  int *pArgS;
  int *pArgC;
  int *pRes;
  Vec_Int_t *vTemp_local;
  int nArgB_local;
  int nArgA_local;
  int *pArgB_local;
  int *pArgA_local;
  Gia_Man_t *pNew_local;
  
  local_54 = fSigned;
  pRes = &vTemp->nCap;
  vTemp_local._0_4_ = nArgB;
  vTemp_local._4_4_ = nArgA;
  _nArgB_local = pArgB;
  pArgB_local = pArgA;
  pArgA_local = (int *)pNew;
  if ((nArgA < 1) || (nArgB < 1)) {
    __assert_fail("nArgA > 0 && nArgB > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x16e,
                  "void Cba_BlastMultiplier(Gia_Man_t *, int *, int *, int, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if ((fSigned != 0) && (fSigned != 1)) {
    __assert_fail("fSigned == 0 || fSigned == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x16f,
                  "void Cba_BlastMultiplier(Gia_Man_t *, int *, int *, int, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  Vec_IntFill(vRes,nArgA + nArgB,0);
  pArgC = Vec_IntArray(vRes);
  Vec_IntFill((Vec_Int_t *)pRes,vTemp_local._4_4_ << 1,0);
  pArgS = Vec_IntArray((Vec_Int_t *)pRes);
  _b = pArgS + vTemp_local._4_4_;
  for (local_50 = 0; local_50 < (int)vTemp_local; local_50 = local_50 + 1) {
    for (Carry = 0; Carry < vTemp_local._4_4_; Carry = Carry + 1) {
      if (Carry == 0) {
        local_80 = pArgC + local_50;
      }
      else {
        local_80 = _b + (Carry + -1);
      }
      local_81 = false;
      if (fSigned != 0) {
        local_81 = (Carry + 1 == vTemp_local._4_4_) != (local_50 + 1 == (int)vTemp_local);
      }
      Cba_BlastFullAdderCtrl
                ((Gia_Man_t *)pArgA_local,pArgB_local[Carry],_nArgB_local[local_50],_b[Carry],
                 pArgS[Carry],pArgS + Carry,local_80,(uint)local_81);
    }
  }
  _b[vTemp_local._4_4_ + -1] = fSigned;
  for (Carry = 0; Carry < vTemp_local._4_4_; Carry = Carry + 1) {
    Cba_BlastFullAdderCtrl
              ((Gia_Man_t *)pArgA_local,1,pArgS[Carry],_b[Carry],local_54,&local_54,
               pArgC + ((int)vTemp_local + Carry),0);
  }
  return;
}

Assistant:

void Cba_BlastMultiplier( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vTemp, Vec_Int_t * vRes, int fSigned )
{
    int * pRes, * pArgC, * pArgS, a, b, Carry = fSigned;
    assert( nArgA > 0 && nArgB > 0 );
    assert( fSigned == 0 || fSigned == 1 );
    // prepare result
    Vec_IntFill( vRes, nArgA + nArgB, 0 );
    pRes = Vec_IntArray( vRes );
    // prepare intermediate storage
    Vec_IntFill( vTemp, 2 * nArgA, 0 );
    pArgC = Vec_IntArray( vTemp );
    pArgS = pArgC + nArgA;
    // create matrix
    for ( b = 0; b < nArgB; b++ )
        for ( a = 0; a < nArgA; a++ )
            Cba_BlastFullAdderCtrl( pNew, pArgA[a], pArgB[b], pArgS[a], pArgC[a], 
                &pArgC[a], a ? &pArgS[a-1] : &pRes[b], fSigned && ((a+1 == nArgA) ^ (b+1 == nArgB)) );
    // final addition
    pArgS[nArgA-1] = fSigned;
    for ( a = 0; a < nArgA; a++ )
        Cba_BlastFullAdderCtrl( pNew, 1, pArgC[a], pArgS[a], Carry, &Carry, &pRes[nArgB+a], 0 );
}